

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplepose.cpp
# Opt level: O0

int detect_posenet(Mat *bgr,vector<KeyPoint,_std::allocator<KeyPoint>_> *keypoints)

{
  int iVar1;
  long in_RDI;
  KeyPoint keypoint;
  float prob;
  int x;
  float *ptr;
  int y;
  int max_y;
  int max_x;
  float max_prob;
  Mat m;
  int p;
  Mat out;
  Extractor ex;
  float norm_vals [3];
  float mean_vals [3];
  Mat in;
  float *in_stack_000001c8;
  int h;
  int w;
  Mat *in_stack_000001d8;
  Net posenet;
  Mat *m_1;
  Net *this;
  Net *in_stack_fffffffffffffc78;
  vector<KeyPoint,_std::allocator<KeyPoint>_> *in_stack_fffffffffffffc80;
  Net *in_stack_fffffffffffffc88;
  void **ppvVar2;
  Net *in_stack_fffffffffffffc90;
  int type;
  Mat *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  uchar *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcd0;
  uint in_stack_fffffffffffffcd8;
  Point_<float> local_314;
  Point_<float> local_30c;
  float local_304;
  float local_300;
  int local_2fc;
  void *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  float local_2e4;
  void *local_2e0;
  int *local_2d8;
  ulong local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  ulong local_2a0;
  int local_294;
  void *local_290;
  int *local_288;
  ulong local_280;
  undefined4 local_278;
  long *local_270;
  int local_268;
  int local_264;
  int local_260;
  undefined4 local_25c;
  int local_258;
  long local_250;
  undefined8 local_238;
  undefined4 local_230;
  undefined8 local_228;
  undefined4 local_220;
  void *local_218;
  int *local_210;
  long *local_1f8;
  int local_1cc;
  int local_1c8;
  undefined1 local_191;
  long local_160;
  void **local_158;
  undefined1 local_14d;
  int local_14c;
  void **local_148;
  void **local_140;
  int local_134;
  void **local_130;
  void **local_120;
  void **local_110;
  void **local_100;
  long *local_f0;
  undefined4 local_e4;
  ulong local_e0;
  void *local_d8;
  undefined4 local_cc;
  void **local_c0;
  undefined4 local_b4;
  long local_b0;
  int local_98;
  undefined4 local_94;
  void **local_90;
  int local_78;
  undefined4 local_74;
  void **local_70;
  int local_58;
  undefined4 local_54;
  void **local_50;
  void *local_30;
  void *local_20;
  
  local_160 = in_RDI;
  ncnn::Net::Net(in_stack_fffffffffffffc90);
  type = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  local_191 = 1;
  iVar1 = ncnn::Net::load_param(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  if (iVar1 != 0) {
    exit(-1);
  }
  iVar1 = ncnn::Net::load_model(in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
  if (iVar1 != 0) {
    exit(-1);
  }
  local_1c8 = *(int *)(local_160 + 0xc);
  local_1cc = *(int *)(local_160 + 8);
  this = (Net *)0x0;
  ncnn::Mat::from_pixels_resize
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8,
             (int)((ulong)in_stack_fffffffffffffca0 >> 0x20),(int)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffcd0,(Allocator *)(ulong)in_stack_fffffffffffffcd8);
  local_228 = 0x42e88f5c42f7599a;
  local_220 = 0x42cf0f5c;
  local_238 = 0x3c8f6ad83c8c4936;
  local_230 = 0x3c8ec7ac;
  ncnn::Mat::substract_mean_normalize(in_stack_000001d8,_w,in_stack_000001c8);
  ncnn::Net::create_extractor(in_stack_fffffffffffffc78);
  ncnn::Extractor::input
            ((Extractor *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  local_158 = &local_290;
  local_290 = (void *)0x0;
  local_288 = (int *)0x0;
  local_280 = 0;
  local_278 = 0;
  local_270 = (long *)0x0;
  local_268 = 0;
  local_264 = 0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_250 = 0;
  ncnn::Extractor::extract
            ((Extractor *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,type);
  std::vector<KeyPoint,_std::allocator<KeyPoint>_>::clear
            ((vector<KeyPoint,_std::allocator<KeyPoint>_> *)0x15dcfa);
  for (local_294 = 0; local_294 < local_258; local_294 = local_294 + 1) {
    local_140 = &local_2e0;
    local_148 = &local_290;
    local_d8 = (void *)((long)local_290 + local_250 * local_294 * local_280);
    local_c0 = &local_2e0;
    local_2d8 = (int *)0x0;
    local_2d0 = local_280;
    local_2c8 = local_278;
    local_2c0 = local_270;
    local_2b4 = local_264;
    local_2b0 = local_260;
    local_2ac = 1;
    local_2a8 = local_25c;
    local_b0 = (long)local_264 * (long)local_260 * local_280;
    local_2a0 = (local_b0 + 0xfU & 0xfffffffffffffff0) / local_280;
    local_2b8 = local_268 + -1;
    if (local_268 == 4) {
      local_2a0 = (long)local_264 * (long)local_260;
    }
    local_b4 = 0x10;
    local_cc = local_25c;
    local_e0 = local_280;
    local_e4 = local_278;
    local_f0 = local_270;
    local_14c = local_294;
    local_14d = 1;
    local_2e4 = 0.0;
    local_2e8 = 0;
    local_2ec = 0;
    for (local_2f0 = 0; local_2f0 < local_260; local_2f0 = local_2f0 + 1) {
      local_134 = local_2f0;
      local_130 = &local_2e0;
      local_2f8 = (void *)((long)local_d8 + (long)local_264 * (long)local_2f0 * local_280);
      for (local_2fc = 0; local_2fc < local_264; local_2fc = local_2fc + 1) {
        local_300 = *(float *)((long)local_2f8 + (long)local_2fc * 4);
        if (local_2e4 < local_300) {
          local_2e8 = local_2fc;
          local_2ec = local_2f0;
          local_2e4 = local_300;
        }
      }
    }
    local_2e0 = local_d8;
    KeyPoint::KeyPoint((KeyPoint *)0x15e2c6);
    cv::Point_<float>::Point_
              (&local_314,(float)(local_2e8 * local_1c8) / (float)local_264,
               (float)(local_2ec * local_1cc) / (float)local_260);
    cv::Point_<float>::operator=(&local_30c,&local_314);
    local_304 = local_2e4;
    std::vector<KeyPoint,_std::allocator<KeyPoint>_>::push_back
              (in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
    ppvVar2 = &local_2e0;
    local_120 = ppvVar2;
    local_50 = ppvVar2;
    if (local_2d8 != (int *)0x0) {
      local_54 = 0xffffffff;
      LOCK();
      local_58 = *local_2d8;
      *local_2d8 = *local_2d8 + -1;
      UNLOCK();
      if (local_58 == 1) {
        if (local_2c0 == (long *)0x0) {
          local_30 = local_2e0;
          if (local_2e0 != (void *)0x0) {
            free(local_2e0);
          }
        }
        else {
          (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  ppvVar2 = &local_290;
  local_110 = ppvVar2;
  local_70 = ppvVar2;
  if (local_288 != (int *)0x0) {
    local_74 = 0xffffffff;
    LOCK();
    local_78 = *local_288;
    *local_288 = *local_288 + -1;
    UNLOCK();
    if (local_78 == 1) {
      if (local_270 == (long *)0x0) {
        local_20 = local_290;
        if (local_290 != (void *)0x0) {
          free(local_290);
        }
      }
      else {
        (**(code **)(*local_270 + 0x18))(local_270,local_290);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  ncnn::Extractor::~Extractor((Extractor *)this);
  ppvVar2 = &local_218;
  local_100 = ppvVar2;
  local_90 = ppvVar2;
  if (local_210 != (int *)0x0) {
    local_94 = 0xffffffff;
    LOCK();
    local_98 = *local_210;
    *local_210 = *local_210 + -1;
    UNLOCK();
    if (local_98 == 1) {
      if (local_1f8 == (long *)0x0) {
        if (local_218 != (void *)0x0) {
          free(local_218);
        }
      }
      else {
        (**(code **)(*local_1f8 + 0x18))(local_1f8,local_218);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  ncnn::Net::~Net(this);
  return 0;
}

Assistant:

static int detect_posenet(const cv::Mat& bgr, std::vector<KeyPoint>& keypoints)
{
    ncnn::Net posenet;

    posenet.opt.use_vulkan_compute = true;

    // the simple baseline human pose estimation from gluon-cv
    // https://gluon-cv.mxnet.io/build/examples_pose/demo_simple_pose.html
    // mxnet model exported via
    //      pose_net.hybridize()
    //      pose_net.export('pose')
    // then mxnet2ncnn
    // the ncnn model https://github.com/nihui/ncnn-assets/tree/master/models
    if (posenet.load_param("pose.param"))
        exit(-1);
    if (posenet.load_model("pose.bin"))
        exit(-1);

    int w = bgr.cols;
    int h = bgr.rows;

    ncnn::Mat in = ncnn::Mat::from_pixels_resize(bgr.data, ncnn::Mat::PIXEL_BGR2RGB, w, h, 192, 256);

    // transforms.ToTensor(),
    // transforms.Normalize((0.485, 0.456, 0.406), (0.229, 0.224, 0.225)),
    // R' = (R / 255 - 0.485) / 0.229 = (R - 0.485 * 255) / 0.229 / 255
    // G' = (G / 255 - 0.456) / 0.224 = (G - 0.456 * 255) / 0.224 / 255
    // B' = (B / 255 - 0.406) / 0.225 = (B - 0.406 * 255) / 0.225 / 255
    const float mean_vals[3] = {0.485f * 255.f, 0.456f * 255.f, 0.406f * 255.f};
    const float norm_vals[3] = {1 / 0.229f / 255.f, 1 / 0.224f / 255.f, 1 / 0.225f / 255.f};
    in.substract_mean_normalize(mean_vals, norm_vals);

    ncnn::Extractor ex = posenet.create_extractor();

    ex.input("data", in);

    ncnn::Mat out;
    ex.extract("conv3_fwd", out);

    // resolve point from heatmap
    keypoints.clear();
    for (int p = 0; p < out.c; p++)
    {
        const ncnn::Mat m = out.channel(p);

        float max_prob = 0.f;
        int max_x = 0;
        int max_y = 0;
        for (int y = 0; y < out.h; y++)
        {
            const float* ptr = m.row(y);
            for (int x = 0; x < out.w; x++)
            {
                float prob = ptr[x];
                if (prob > max_prob)
                {
                    max_prob = prob;
                    max_x = x;
                    max_y = y;
                }
            }
        }

        KeyPoint keypoint;
        keypoint.p = cv::Point2f(max_x * w / (float)out.w, max_y * h / (float)out.h);
        keypoint.prob = max_prob;

        keypoints.push_back(keypoint);
    }

    return 0;
}